

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall WELL44497b::test_method(WELL44497b *this)

{
  WELL44497b *this_local;
  
  WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_boost::random::detail::M3<-24>,_boost::random::detail::M3<30>,_boost::random::detail::M3<-10>,_boost::random::detail::M2<-26>,_boost::random::detail::M1,_boost::random::detail::M3<20>,_boost::random::detail::M6<32UL,_9U,_5U,_14U,_3072982252U>,_boost::random::detail::M1,_boost::random::detail::matsumoto_kurita_tempering<2480739328U,_4195450880U>_>,_2483442811U>
  ::run();
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(abc)
{
    typedef boost::random::well512a RandomNumberGenerator;
    RandomNumberGenerator rng;

    unsigned state[RandomNumberGenerator::state_size] = {};
    state[RandomNumberGenerator::state_size - 1] = 1;

    unsigned* p = state;
    rng.seed(p, boost::end(state));

    unsigned x;

    int iterations = 9999;

    while (iterations-- > 0)
        x = rng();

    BOOST_CHECK_EQUAL(x, 0x4df08652U);
}